

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O3

int64_t __thiscall TPZFront<float>::NFree(TPZFront<float> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (this->fGlobal).super_TPZVec<long>.fNElements;
  if (0 < lVar1) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar2 = lVar2 + (ulong)((this->fGlobal).super_TPZVec<long>.fStore[lVar3] == -1);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
    return lVar2;
  }
  return 0;
}

Assistant:

int64_t TPZFront<TVar>::NFree()
{
	int64_t i;
	int64_t free_eq=0;
	for(i=0;i<fGlobal.NElements();i++)
	{
		if(fGlobal[i]==-1){
			free_eq=free_eq+1;
		}
	}
	return free_eq;
}